

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isHandleType(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  Type *ct;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  bool local_1;
  
  pTVar2 = getCanonicalType((Type *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  SVar1 = (pTVar2->super_Symbol).kind;
  if ((((SVar1 - ClassType < 2) || (SVar1 - NullType < 2)) || (SVar1 == EventType)) ||
     (SVar1 == VirtualInterfaceType)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Type::isHandleType() const {
    auto ct = &getCanonicalType();
    switch (ct->kind) {
        case SymbolKind::VirtualInterfaceType:
        case SymbolKind::ClassType:
        case SymbolKind::CHandleType:
        case SymbolKind::CovergroupType:
        case SymbolKind::EventType:
        case SymbolKind::NullType:
            return true;
        default:
            return false;
    }
}